

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int idr_start(archive_write *a,idr *idr,int cnt,int ffmax,int num_size,int null_size,
             archive_rb_tree_ops *rbt_ops)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  archive_write *in_RSI;
  int in_R8D;
  int in_R9D;
  archive_rb_tree_ops *in_stack_00000008;
  int r;
  int local_4;
  
  local_4 = idr_ensure_poolsize(in_RSI,(idr *)CONCAT44(in_EDX,in_ECX),in_R8D);
  if (local_4 == 0) {
    __archive_rb_tree_init((archive_rb_tree *)&(in_RSI->archive).vtable,in_stack_00000008);
    (in_RSI->archive).archive_format_name = (char *)0x0;
    *(char ***)&(in_RSI->archive).compression_code = &(in_RSI->archive).archive_format_name;
    *(undefined4 *)((long)&(in_RSI->archive).compression_name + 4) = 0;
    (in_RSI->archive).file_count = in_R8D;
    (in_RSI->archive).archive_error_number = in_R9D;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
idr_start(struct archive_write *a, struct idr *idr, int cnt, int ffmax,
    int num_size, int null_size, const struct archive_rb_tree_ops *rbt_ops)
{
	int r;

	(void)ffmax; /* UNUSED */

	r = idr_ensure_poolsize(a, idr, cnt);
	if (r != ARCHIVE_OK)
		return (r);
	__archive_rb_tree_init(&(idr->rbtree), rbt_ops);
	idr->wait_list.first = NULL;
	idr->wait_list.last = &(idr->wait_list.first);
	idr->pool_idx = 0;
	idr->num_size = num_size;
	idr->null_size = null_size;
	return (ARCHIVE_OK);
}